

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O2

RK_S32 av1_extract_obu(AV1OBU *obu,uint8_t *buf,RK_S32 length)

{
  RK_S32 RVar1;
  ulong uVar2;
  long lVar3;
  RK_S32 spatial_id;
  RK_S32 temporal_id;
  RK_S32 type;
  RK_S32 has_size_flag;
  RK_S32 extension_flag;
  uint local_a4;
  uint8_t *local_a0;
  AV1OBU *local_98;
  RK_S32 local_8c;
  BitReadCtx_t gb;
  
  local_8c = 0;
  RVar1 = 10;
  if (length < 10) {
    RVar1 = length;
  }
  mpp_set_bitread_ctx(&gb,buf,RVar1);
  mpp_read_bits(&gb,1,&local_8c);
  if (local_8c == 0) {
    mpp_read_bits(&gb,4,&type);
    mpp_read_bits(&gb,1,&extension_flag);
    mpp_read_bits(&gb,1,&has_size_flag);
    mpp_skip_bits(&gb,1);
    if (extension_flag == 0) {
      spatial_id = 0;
      temporal_id = 0;
    }
    else {
      mpp_read_bits(&gb,3,&temporal_id);
      mpp_read_bits(&gb,2,&spatial_id);
      mpp_skip_bits(&gb,3);
    }
    if (has_size_flag == 0) {
      uVar2 = (ulong)(~extension_flag + length);
    }
    else {
      local_a4 = 0;
      uVar2 = 0;
      lVar3 = 0;
      local_a0 = buf;
      local_98 = obu;
      do {
        buf = local_a0;
        obu = local_98;
        if (lVar3 + 7 == 0x3f) break;
        mpp_read_bits(&gb,8,(RK_S32 *)&local_a4);
        uVar2 = uVar2 | (ulong)(local_a4 & 0x7f) << ((byte)lVar3 & 0x3f);
        buf = local_a0;
        lVar3 = lVar3 + 7;
        obu = local_98;
      } while ((char)local_a4 < '\0');
    }
    RVar1 = mpp_get_bits_left(&gb);
    if (-1 < RVar1) {
      RVar1 = mpp_get_bits_count(&gb);
      lVar3 = uVar2 + (long)(RVar1 / 8);
      if (lVar3 <= length) {
        if (-1 < (int)lVar3) {
          obu->type = type;
          obu->temporal_id = temporal_id;
          obu->spatial_id = spatial_id;
          obu->data = buf + RVar1 / 8;
          obu->size = (int)uVar2;
          obu->raw_data = buf;
          obu->raw_size = (int)lVar3;
          if (((byte)av1d_debug & 8) != 0) {
            _mpp_log_l(4,"av1d_parser",
                       "obu_type: %d, temporal_id: %d, spatial_id: %d, payload size: %d\n",
                       "av1_extract_obu",(ulong)(uint)type,(ulong)(uint)temporal_id,
                       (ulong)(uint)spatial_id,uVar2);
          }
        }
        goto LAB_001b4f7b;
      }
    }
  }
  lVar3 = 0xfffffc11;
LAB_001b4f7b:
  return (RK_S32)lVar3;
}

Assistant:

RK_S32 av1_extract_obu(AV1OBU *obu, uint8_t *buf, RK_S32 length)
{
    int64_t obu_size;
    RK_S32 start_pos, type, temporal_id, spatial_id;
    RK_S32 len;

    len = parse_obu_header(buf, length, &obu_size, &start_pos,
                           &type, &temporal_id, &spatial_id);
    if (len < 0)
        return len;

    obu->type        = type;
    obu->temporal_id = temporal_id;
    obu->spatial_id  = spatial_id;

    obu->data     = buf + start_pos;
    obu->size     = obu_size;
    obu->raw_data = buf;
    obu->raw_size = len;

    av1d_dbg(AV1D_DBG_STRMIN, "obu_type: %d, temporal_id: %d, spatial_id: %d, payload size: %d\n",
             obu->type, obu->temporal_id, obu->spatial_id, obu->size);

    return len;
}